

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::writeTarget
          (PromiseClient *this,Builder target)

{
  long in_RSI;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar1;
  
  *(undefined1 *)(in_RSI + 0x68) = 1;
  MVar1 = RpcConnectionState::writeTarget
                    ((RpcConnectionState *)this,*(ClientHook **)(in_RSI + 0x28),target);
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      receivedCall = true;
      return connectionState->writeTarget(*cap, target);
    }